

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str *
tinyformat::
format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
          (bilingual_str *fmt,char **args,char (*args_1) [42],
          _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
          *args_2)

{
  long lVar1;
  char **args_00;
  string *fmt_00;
  anon_class_1_0_00000001 *this;
  char (*in_RSI) [42];
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  undefined1 in_stack_ffffffffffffff4f;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_stack_ffffffffffffff50;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  args_00 = format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>(bilingual_str_const&,char_const*const&,char_const(&)[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>const&)
            ::{lambda(auto:1_const&,bool)#1}::operator()
                      (in_stack_ffffffffffffff58,(char **)in_stack_ffffffffffffff50,
                       (bool)in_stack_ffffffffffffff4f);
  fmt_00 = (string *)
           format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>(bilingual_str_const&,char_const*const&,char_const(&)[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>const&)
           ::{lambda(auto:1_const&,bool)#1}::operator()
                     (in_stack_ffffffffffffff58,(char (*) [42])in_stack_ffffffffffffff50,
                      (bool)in_stack_ffffffffffffff4f);
  format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>(bilingual_str_const&,char_const*const&,char_const(&)[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
  format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
            (fmt_00,args_00,in_RSI,
             (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
              *)CONCAT44(uVar2,in_stack_ffffffffffffff70));
  format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>(bilingual_str_const&,char_const*const&,char_const(&)[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff58,(char **)in_stack_ffffffffffffff50,
             (bool)in_stack_ffffffffffffff4f);
  this = (anon_class_1_0_00000001 *)
         format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>(bilingual_str_const&,char_const*const&,char_const(&)[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>const&)
         ::{lambda(auto:1_const&,bool)#1}::operator()
                   (in_stack_ffffffffffffff58,(char (*) [42])in_stack_ffffffffffffff50,
                    (bool)in_stack_ffffffffffffff4f);
  format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>(bilingual_str_const&,char_const*const&,char_const(&)[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (this,in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
  format<char_const*,char[42],std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
            (fmt_00,args_00,in_RSI,
             (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
              *)CONCAT44(uVar2,in_stack_ffffffffffffff70));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}